

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QString * __thiscall QtPrivate::QCalendarModel::dayName(QCalendarModel *this,DayOfWeek day)

{
  byte bVar1;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QString standaloneDayName;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QWidget *pQVar2;
  undefined4 in_stack_ffffffffffffff88;
  int iVar3;
  QLocale local_58;
  QLocale local_50;
  QLocale local_48;
  undefined1 local_40 [24];
  QLocale local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *(int *)(in_RSI + 0x44);
  pQVar2 = in_RDI;
  if (iVar3 == 1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale(in_RDI);
    QLocale::standaloneDayName((int)&local_20,(FormatType)&local_28);
    QLocale::~QLocale(&local_28);
    QWidget::locale(pQVar2);
    QLocale::dayName((int)local_40,(FormatType)&local_48);
    bVar1 = ::operator==((QString *)in_RDI,
                         (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    QString::~QString((QString *)0x518ced);
    QLocale::~QLocale(&local_48);
    if ((bVar1 & 1) == 0) {
      QString::QString((QString *)in_RDI,(QString *)CONCAT17(bVar1,in_stack_ffffffffffffff68));
    }
    else {
      QString::left((QString *)CONCAT44(iVar3,in_stack_ffffffffffffff88),in_RSI);
    }
    QString::~QString((QString *)0x518d40);
  }
  else if (iVar3 == 2) {
    QWidget::locale(in_RDI);
    QLocale::dayName((int)in_RDI,(FormatType)&local_50);
    QLocale::~QLocale(&local_50);
  }
  else if (iVar3 == 3) {
    QWidget::locale(in_RDI);
    QLocale::dayName((int)in_RDI,(FormatType)&local_58);
    QLocale::~QLocale(&local_58);
  }
  else {
    QString::QString((QString *)0x518dbf);
    pQVar2 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarModel::dayName(Qt::DayOfWeek day) const
{
    switch (m_horizontalHeaderFormat) {
        case QCalendarWidget::SingleLetterDayNames: {
            QString standaloneDayName = m_view->locale().standaloneDayName(day, QLocale::NarrowFormat);
            if (standaloneDayName == m_view->locale().dayName(day, QLocale::NarrowFormat))
                return standaloneDayName.left(1);
            return standaloneDayName;
        }
        case QCalendarWidget::ShortDayNames:
            return m_view->locale().dayName(day, QLocale::ShortFormat);
        case QCalendarWidget::LongDayNames:
            return m_view->locale().dayName(day, QLocale::LongFormat);
        default:
            break;
    }
    return QString();
}